

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall QGraphicsItem::setScale(QGraphicsItem *this,qreal factor)

{
  double dVar1;
  QGraphicsItemPrivate *pQVar2;
  TransformData *this_00;
  long *in_RDI;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  qreal newScale;
  QVariant newScaleVariant;
  double local_a0;
  QVariant local_88;
  undefined8 in_stack_ffffffffffffff98;
  QVariant local_48;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  prepareGeometryChange((QGraphicsItem *)in_stack_ffffffffffffff98);
  pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)(in_RDI + 1));
  local_a0 = in_XMM0_Qa;
  if ((*(ulong *)&pQVar2->field_0x160 & 0x80000000000) != 0) {
    local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    ::QVariant::QVariant(&local_48,in_XMM0_Qa);
    (**(code **)(*in_RDI + 0x108))(&local_28,in_RDI,0x1e,&local_48);
    ::QVariant::~QVariant(&local_48);
    local_a0 = (double)::QVariant::toReal((bool *)local_28.data);
    ::QVariant::~QVariant((QVariant *)&local_28);
  }
  pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)(in_RDI + 1));
  if (pQVar2->transformData == (TransformData *)0x0) {
    this_00 = (TransformData *)operator_new(0x90);
    QGraphicsItemPrivate::TransformData::TransformData(this_00);
    pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(in_RDI + 1));
    pQVar2->transformData = this_00;
  }
  pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)(in_RDI + 1));
  dVar1 = pQVar2->transformData->scale;
  if ((dVar1 != local_a0) || (NAN(dVar1) || NAN(local_a0))) {
    pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(in_RDI + 1));
    pQVar2->transformData->scale = local_a0;
    pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(in_RDI + 1));
    pQVar2->transformData->onlyTransform = false;
    pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(in_RDI + 1));
    *(ulong *)&pQVar2->field_0x160 =
         *(ulong *)&pQVar2->field_0x160 & 0xffdfffffffffffff | 0x20000000000000;
    pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(in_RDI + 1));
    if ((*(ulong *)&pQVar2->field_0x160 & 0x80000000000) != 0) {
      ::QVariant::QVariant(&local_88,local_a0);
      (**(code **)(*in_RDI + 0x108))(&stack0xffffffffffffff98,in_RDI,0x1f,&local_88);
      ::QVariant::~QVariant((QVariant *)&stack0xffffffffffffff98);
      ::QVariant::~QVariant(&local_88);
    }
    pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(in_RDI + 1));
    if ((*(ulong *)&pQVar2->field_0x160 >> 0x38 & 1) != 0) {
      QGraphicsObject::scaleChanged((QGraphicsObject *)0x97e8de);
    }
    pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(in_RDI + 1));
    (*pQVar2->_vptr_QGraphicsItemPrivate[4])();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsItem::setScale(qreal factor)
{
    prepareGeometryChange();
    qreal newScale = factor;

    if (d_ptr->flags & ItemSendsGeometryChanges) {
        // Notify the item that the scale is changing.
        const QVariant newScaleVariant(itemChange(ItemScaleChange, factor));
        newScale = newScaleVariant.toReal();
    }

    if (!d_ptr->transformData)
        d_ptr->transformData = new QGraphicsItemPrivate::TransformData;

    if (d_ptr->transformData->scale == newScale)
        return;

    d_ptr->transformData->scale = newScale;
    d_ptr->transformData->onlyTransform = false;
    d_ptr->dirtySceneTransform = 1;

    // Send post-notification.
    if (d_ptr->flags & ItemSendsGeometryChanges)
        itemChange(ItemScaleHasChanged, newScale);

    if (d_ptr->isObject)
        emit static_cast<QGraphicsObject *>(this)->scaleChanged();

    d_ptr->transformChanged();
}